

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O0

string * vkt::tessellation::anon_unknown_1::glslTraverseBasicTypes
                   (string *__return_storage_ptr__,string *rootName,VarType *rootType,
                   int arrayNestingDepth,int indentationDepth,BasicTypeVisitFunc visit)

{
  undefined8 uVar1;
  bool bVar2;
  DataType DVar3;
  size_type __n;
  char *__rhs;
  VarType *pVVar4;
  allocator<char> local_399;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  string local_358;
  StructMember *local_338;
  StructMember *member;
  undefined1 local_325;
  int membNdx;
  StructType *pSStack_320;
  int numMembers;
  StructType *structType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  int local_294;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  int local_cc;
  undefined1 local_c8 [8];
  string arrayLength;
  undefined1 local_88 [8];
  string loopIndexName;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string indentation;
  BasicTypeVisitFunc visit_local;
  int indentationDepth_local;
  int arrayNestingDepth_local;
  VarType *rootType_local;
  string *rootName_local;
  string *result;
  
  indentation.field_2._8_8_ = visit;
  visit_local._0_4_ = indentationDepth;
  visit_local._4_4_ = arrayNestingDepth;
  _indentationDepth_local = rootType;
  rootType_local = (VarType *)rootName;
  rootName_local = __return_storage_ptr__;
  bVar2 = glu::VarType::isBasicType(rootType);
  pVVar4 = rootType_local;
  uVar1 = indentation.field_2._8_8_;
  if (bVar2) {
    DVar3 = glu::VarType::getBasicType(_indentationDepth_local);
    (*(code *)uVar1)(__return_storage_ptr__,pVVar4,DVar3,(int)visit_local);
  }
  else {
    bVar2 = glu::VarType::isArrayType(_indentationDepth_local);
    if (bVar2) {
      __n = (size_type)(int)visit_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__n,'\t',&local_51);
      std::allocator<char>::~allocator(&local_51);
      de::toString<int>((string *)((long)&arrayLength.field_2 + 8),(int *)((long)&visit_local + 4));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     "i",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&arrayLength.field_2 + 8));
      std::__cxx11::string::~string((string *)(arrayLength.field_2._M_local_buf + 8));
      local_cc = glu::VarType::getArraySize(_indentationDepth_local);
      de::toString<int>((string *)local_c8,&local_cc);
      std::operator+(&local_270,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "for (int ");
      std::operator+(&local_250,&local_270,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      std::operator+(&local_230,&local_250," = 0; ");
      std::operator+(&local_210,&local_230,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      std::operator+(&local_1f0,&local_210," < ");
      local_294 = glu::VarType::getArraySize(_indentationDepth_local);
      de::toString<int>(&local_290,&local_294);
      std::operator+(&local_1d0,&local_1f0,&local_290);
      std::operator+(&local_1b0,&local_1d0,"; ++");
      std::operator+(&local_190,&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      std::operator+(&local_170,&local_190,")\n");
      std::operator+(&local_150,&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      std::operator+(&local_130,&local_150,"{\n");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &structType,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     rootType_local,"[");
      std::operator+(&local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &structType,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      std::operator+(&local_2d8,&local_2f8,"]");
      pVVar4 = glu::VarType::getElementType(_indentationDepth_local);
      glslTraverseBasicTypes
                (&local_2b8,&local_2d8,pVVar4,visit_local._4_4_ + 1,(int)visit_local + 1,
                 (BasicTypeVisitFunc)indentation.field_2._8_8_);
      std::operator+(&local_110,&local_130,&local_2b8);
      std::operator+(&local_f0,&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      std::operator+(__return_storage_ptr__,&local_f0,"}\n");
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&structType);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)local_c8);
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::~string((string *)local_50);
    }
    else {
      bVar2 = glu::VarType::isStructType(_indentationDepth_local);
      if (bVar2) {
        pSStack_320 = glu::VarType::getStructPtr(_indentationDepth_local);
        membNdx = glu::StructType::getNumMembers(pSStack_320);
        local_325 = 0;
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        for (member._4_4_ = 0; member._4_4_ < membNdx; member._4_4_ = member._4_4_ + 1) {
          local_338 = glu::StructType::getMember(pSStack_320,member._4_4_);
          std::operator+(&local_398,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         rootType_local,".");
          __rhs = glu::StructMember::getName(local_338);
          std::operator+(&local_378,&local_398,__rhs);
          pVVar4 = glu::StructMember::getType(local_338);
          glslTraverseBasicTypes
                    (&local_358,&local_378,pVVar4,visit_local._4_4_,(int)visit_local,
                     (BasicTypeVisitFunc)indentation.field_2._8_8_);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_358);
          std::__cxx11::string::~string((string *)&local_358);
          std::__cxx11::string::~string((string *)&local_378);
          std::__cxx11::string::~string((string *)&local_398);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,(char *)0x0,&local_399);
        std::allocator<char>::~allocator(&local_399);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string glslTraverseBasicTypes (const std::string&			rootName,
									const glu::VarType&			rootType,
									const int					arrayNestingDepth,
									const int					indentationDepth,
									const BasicTypeVisitFunc	visit)
{
	if (rootType.isBasicType())
		return visit(rootName, rootType.getBasicType(), indentationDepth);
	else if (rootType.isArrayType())
	{
		const std::string indentation	= std::string(indentationDepth, '\t');
		const std::string loopIndexName	= "i" + de::toString(arrayNestingDepth);
		const std::string arrayLength	= de::toString(rootType.getArraySize());
		return indentation + "for (int " + loopIndexName + " = 0; " + loopIndexName + " < " + de::toString(rootType.getArraySize()) + "; ++" + loopIndexName + ")\n" +
			   indentation + "{\n" +
			   glslTraverseBasicTypes(rootName + "[" + loopIndexName + "]", rootType.getElementType(), arrayNestingDepth+1, indentationDepth+1, visit) +
			   indentation + "}\n";
	}
	else if (rootType.isStructType())
	{
		const glu::StructType&	structType = *rootType.getStructPtr();
		const int				numMembers = structType.getNumMembers();
		std::string				result;

		for (int membNdx = 0; membNdx < numMembers; ++membNdx)
		{
			const glu::StructMember& member = structType.getMember(membNdx);
			result += glslTraverseBasicTypes(rootName + "." + member.getName(), member.getType(), arrayNestingDepth, indentationDepth, visit);
		}

		return result;
	}
	else
	{
		DE_ASSERT(false);
		return DE_NULL;
	}
}